

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O2

wchar_t monster_primary_group_size(chunk_conflict *c,monster *mon)

{
  wchar_t wVar1;
  monster_group *pmVar2;
  
  pmVar2 = c->monster_groups[mon->group_info[0].index];
  wVar1 = L'\xffffffff';
  do {
    pmVar2 = (monster_group *)pmVar2->member_list;
    wVar1 = wVar1 + L'\x01';
  } while (pmVar2 != (monster_group *)0x0);
  return wVar1;
}

Assistant:

int monster_primary_group_size(struct chunk *c, const struct monster *mon)
{
	int count = 0;
	int index = mon->group_info[PRIMARY_GROUP].index;
	struct monster_group *group = c->monster_groups[index];
	struct mon_group_list_entry *entry = group->member_list;

	while (entry) {
		count++;
		entry = entry->next;
	}
	return count;
}